

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackComponentGroup.h
# Opt level: O2

void __thiscall cmCPackComponent::cmCPackComponent(cmCPackComponent *this,cmCPackComponent *param_1)

{
  std::__cxx11::string::string((string *)this,(string *)param_1);
  std::__cxx11::string::string((string *)&this->DisplayName,(string *)&param_1->DisplayName);
  this->field_0x48 = param_1->field_0x48;
  this->Group = param_1->Group;
  std::__cxx11::string::string((string *)&this->Description,(string *)&param_1->Description);
  std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::vector
            (&this->InstallationTypes,&param_1->InstallationTypes);
  std::__cxx11::string::string((string *)&this->ArchiveFile,(string *)&param_1->ArchiveFile);
  std::__cxx11::string::string((string *)&this->Plist,(string *)&param_1->Plist);
  std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::vector
            (&this->Dependencies,&param_1->Dependencies);
  std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::vector
            (&this->ReverseDependencies,&param_1->ReverseDependencies);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Files,&param_1->Files);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Directories,&param_1->Directories);
  this->TotalSize = param_1->TotalSize;
  return;
}

Assistant:

cmCPackComponent()
    : IsRequired(true)
    , IsHidden(false)
    , IsDisabledByDefault(false)
    , IsDownloaded(false)
  {
  }